

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O1

bool __thiscall
ON_Circle::GetTightBoundingBox
          (ON_Circle *this,ON_BoundingBox *tight_bbox,bool bGrowBox,ON_Xform *xform)

{
  double *pdVar1;
  double dVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ON_Arc arc;
  ON_Arc local_c0;
  
  if ((xform != (ON_Xform *)0x0) && (bVar3 = ON_Xform::IsIdentity(xform,0.0), !bVar3)) {
    ON_Arc::ON_Arc(&local_c0,this,6.283185307179586);
    bVar3 = ON_Arc::GetTightBoundingBox(&local_c0,tight_bbox,bGrowBox,xform);
    ON_Plane::~ON_Plane((ON_Plane *)&local_c0);
    return bVar3;
  }
  if (bGrowBox) {
    bVar3 = ON_BoundingBox::IsValid(tight_bbox);
    bGrowBox = bVar3 && bGrowBox;
  }
  dVar2 = this->radius;
  dVar4 = ON_Length2d((this->plane).zaxis.y,(this->plane).zaxis.z);
  dVar4 = dVar4 * dVar2;
  dVar2 = this->radius;
  dVar5 = ON_Length2d((this->plane).zaxis.z,(this->plane).zaxis.x);
  dVar5 = dVar5 * dVar2;
  dVar2 = this->radius;
  dVar6 = ON_Length2d((this->plane).zaxis.x,(this->plane).zaxis.y);
  dVar6 = dVar6 * dVar2;
  dVar2 = (this->plane).origin.x;
  dVar7 = dVar2 - dVar4;
  if (bGrowBox == false) {
    (tight_bbox->m_min).x = dVar7;
    (tight_bbox->m_max).x = dVar4 + dVar2;
    dVar2 = (this->plane).origin.y;
    (tight_bbox->m_min).y = dVar2 - dVar5;
    (tight_bbox->m_max).y = dVar5 + dVar2;
    dVar2 = (this->plane).origin.z;
    (tight_bbox->m_min).z = dVar2 - dVar6;
    (tight_bbox->m_max).z = dVar6 + dVar2;
  }
  else {
    if (dVar7 < (tight_bbox->m_min).x) {
      (tight_bbox->m_min).x = dVar7;
    }
    dVar4 = dVar4 + dVar2;
    if ((tight_bbox->m_max).x <= dVar4 && dVar4 != (tight_bbox->m_max).x) {
      (tight_bbox->m_max).x = dVar4;
    }
    dVar2 = (this->plane).origin.y;
    dVar4 = dVar2 - dVar5;
    if (dVar4 < (tight_bbox->m_min).y) {
      (tight_bbox->m_min).y = dVar4;
    }
    dVar5 = dVar5 + dVar2;
    pdVar1 = &(tight_bbox->m_max).y;
    if (*pdVar1 <= dVar5 && dVar5 != *pdVar1) {
      (tight_bbox->m_max).y = dVar5;
    }
    dVar2 = (this->plane).origin.z;
    dVar4 = dVar2 - dVar6;
    if (dVar4 < (tight_bbox->m_min).z) {
      (tight_bbox->m_min).z = dVar4;
    }
    dVar6 = dVar6 + dVar2;
    pdVar1 = &(tight_bbox->m_max).z;
    if (*pdVar1 <= dVar6 && dVar6 != *pdVar1) {
      (tight_bbox->m_max).z = dVar6;
    }
  }
  return true;
}

Assistant:

bool ON_Circle::GetTightBoundingBox( 
		ON_BoundingBox& tight_bbox, 
    bool bGrowBox,
		const ON_Xform* xform
    ) const
{
  // April 8, 2010 Dale Lear: 
  //   Changed this function to be faster when xform is the identity.
  if ( 0 != xform && !xform->IsIdentity() )
  {
    // The ON_Arc version handles all transformations including
    // ones that are not in rotations.
    ON_Arc arc(*this,2.0*ON_PI);
    return arc.GetTightBoundingBox(tight_bbox,bGrowBox,xform);
  }

  if ( bGrowBox && !tight_bbox.IsValid() )
  {
    bGrowBox = false;
  }

  const double rx = radius*ON_Length2d(plane.zaxis.y, plane.zaxis.z);
  const double ry = radius*ON_Length2d(plane.zaxis.z, plane.zaxis.x);
  const double rz = radius*ON_Length2d(plane.zaxis.x, plane.zaxis.y);
  if ( bGrowBox )
  {    
    if ( plane.origin.x-rx < tight_bbox.m_min.x )
      tight_bbox.m_min.x = plane.origin.x-rx;
    if ( plane.origin.x+rx > tight_bbox.m_max.x )
      tight_bbox.m_max.x = plane.origin.x+rx;
    if ( plane.origin.y-ry < tight_bbox.m_min.y )
      tight_bbox.m_min.y = plane.origin.y-ry;
    if ( plane.origin.y+ry > tight_bbox.m_max.y )
      tight_bbox.m_max.y = plane.origin.y+ry;
    if ( plane.origin.z-rz < tight_bbox.m_min.z )
      tight_bbox.m_min.z = plane.origin.z-rz;
    if ( plane.origin.z+rz > tight_bbox.m_max.z )
      tight_bbox.m_max.z = plane.origin.z+rz;
  }
  else
  {
    tight_bbox.m_min.x = plane.origin.x-rx;
    tight_bbox.m_max.x = plane.origin.x+rx;
    tight_bbox.m_min.y = plane.origin.y-ry;
    tight_bbox.m_max.y = plane.origin.y+ry;
    tight_bbox.m_min.z = plane.origin.z-rz;
    tight_bbox.m_max.z = plane.origin.z+rz;
  }  

  return true;  
}